

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetBindFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 BindFlags,char *Delimiter)

{
  uint uVar1;
  ulong uVar2;
  Uint32 Flag;
  uint uVar3;
  Uint32 in_stack_ffffffffffffffbc;
  string msg;
  
  if ((int)this == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",(allocator *)&msg);
  }
  else {
    uVar2 = (ulong)this & 0xffffffff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar3 = 1; (uVar1 = (uint)uVar2, uVar1 != 0 && (uVar3 < 0x801)); uVar3 = uVar3 * 2) {
      if ((uVar3 & uVar1) != 0) {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        GetBindFlagString(in_stack_ffffffffffffffbc);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar2 = (ulong)(uVar1 & ~uVar3);
      }
    }
    if (uVar1 != 0) {
      FormatString<char[24]>(&msg,(char (*) [24])"Unknown bind flags left");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetBindFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4af);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetBindFlagsString(Uint32 BindFlags, const char* Delimiter)
{
    if (BindFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = 1; BindFlags && Flag <= BIND_FLAG_LAST; Flag <<= 1)
    {
        if (BindFlags & Flag)
        {
            if (!Str.empty())
                Str += Delimiter;
            Str += GetBindFlagString(Flag);
            BindFlags &= ~Flag;
        }
    }
    VERIFY(BindFlags == 0, "Unknown bind flags left");
    return Str;
}